

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,float> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  undefined8 uVar1;
  rc_data *prVar2;
  item *piVar3;
  int iVar4;
  size_type sVar5;
  uint uVar6;
  int8_t *piVar7;
  long lVar8;
  value_type *pvVar9;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>_>
  _Var10;
  solver_failure *this_00;
  int iVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  
  if (r_size < 4) {
    details::fail_fast("Assertion","r_size >= 4",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"453");
  }
  if (bk_max < bk_min) {
    details::fail_fast("Assertion","bk_min <= bk_max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"454");
  }
  *(int *)(this + 0x5c) = bk_min;
  *(int *)(this + 0x60) = bk_max;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
  ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
            *)(this + 0x20),(ulong)(uint)r_size);
  iVar4 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
  if ((char)iVar4 == '\0') {
    this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
    solver_failure::solver_failure(this_00,no_solver_available);
    __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar5 = shared_subvector::emplace((shared_subvector *)this);
  *(size_type *)(this + 0x58) = sVar5;
  if (sVar5 == 0) {
    if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
      *(long *)(this + 0x40) = *(long *)(this + 0x38);
    }
    prVar2 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar14 = *(long *)(this + 0x20);
    for (lVar12 = 0; (ulong)(uint)r_size * 0xc - lVar12 != 0; lVar12 = lVar12 + 0xc) {
      *(undefined4 *)(lVar14 + lVar12 * 2) = *(undefined4 *)((long)&prVar2->value + lVar12);
      *(undefined4 *)(lVar14 + 0x10 + lVar12 * 2) = *(undefined4 *)((long)&prVar2->id + lVar12);
      iVar4 = *(int *)((long)&prVar2->f + lVar12);
      *(int *)(lVar14 + 0xc + lVar12 * 2) = iVar4;
      iVar11 = -iVar4;
      if (0 < iVar4) {
        iVar11 = iVar4;
      }
      *(int *)(lVar14 + 8 + lVar12 * 2) = iVar11;
      *(undefined4 *)(lVar14 + 0x14 + lVar12 * 2) = 0;
    }
    piVar7 = shared_subvector::element_data((shared_subvector *)this,0);
    std::__fill_n_a<signed_char*,unsigned_int,int>(piVar7,*(undefined4 *)(this + 0x18));
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    lVar14 = *(long *)(this + 0x28);
    lVar12 = *(long *)(this + 0x20);
    piVar13 = (int *)(lVar12 + 0xc);
    lVar8 = (lVar14 - lVar12) / 0x18;
    iVar4 = *(int *)(this + 0x5c);
    iVar11 = *(int *)(this + 0x60);
    lVar15 = lVar8;
    while (bVar16 = lVar15 != 0, lVar15 = lVar15 + -1, bVar16) {
      if (*piVar13 < 0) {
        iVar4 = iVar4 + piVar13[-1];
        iVar11 = iVar11 + piVar13[-1];
        *(int *)(this + 0x5c) = iVar4;
        *(int *)(this + 0x60) = iVar11;
      }
      piVar13 = piVar13 + 6;
    }
    *(undefined4 *)(lVar14 + -0x14) = *(undefined4 *)(lVar14 + -0x18);
    for (uVar6 = (int)lVar8 - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      lVar14 = (ulong)uVar6 * 0x18;
      *(float *)(lVar12 + 4 + lVar14) =
           *(float *)(lVar12 + 0x1c + lVar14) + *(float *)(lVar12 + lVar14);
    }
    if (iVar11 == iVar4) {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_equality
                ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *)this);
    }
    else {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::solve_inequality
                ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *)this);
    }
    lVar14 = *(long *)(this + 0x20);
    iVar4 = 0;
    lVar12 = *(long *)(this + 0x28) - lVar14;
    for (lVar15 = 0; (lVar12 / 0x18 & 0xffffffffU) * 0x18 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
      iVar11 = *(int *)(lVar14 + 0xc + lVar15);
      pvVar9 = shared_subvector::operator[]((shared_subvector *)this,*(int *)(this + 0x58) + iVar4);
      lVar14 = *(long *)(this + 0x20);
      iVar4 = iVar4 + 1;
      *(uint *)(lVar14 + 0x14 + lVar15) = (uint)((*pvVar9 == '\0') != 0 < iVar11);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                       (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    lVar14 = *(long *)(this + 0x20);
    piVar3 = *(item **)(this + 0x28);
    lVar12 = ((long)piVar3 - lVar14) / 0x18;
    prVar2 = (reduced_cost->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
             ._M_head_impl;
    lVar15 = 0;
    while (bVar16 = lVar12 != 0, lVar12 = lVar12 + -1, bVar16) {
      *(undefined4 *)((long)&prVar2->value + lVar15) = *(undefined4 *)(lVar14 + lVar15 * 2);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)(lVar14 + 0xc + lVar15 * 2);
      auVar17 = vshufps_avx(auVar17,auVar17,0xe1);
      uVar1 = vmovlps_avx(auVar17);
      *(undefined8 *)((long)&prVar2->id + lVar15) = uVar1;
      lVar15 = lVar15 + 0xc;
    }
    if (_Var10._M_current == piVar3) {
      uVar6 = -(uint)(*(int *)(lVar14 + 0x14) == 0) | r_size;
    }
    else {
      uVar6 = (int)(((long)_Var10._M_current - lVar14) / 0x18) - 1;
    }
    return uVar6;
  }
  details::fail_fast("Assertion","solution == 0u",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                     ,"465");
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }